

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O0

int __thiscall ncnn::GRU::load_model(GRU *this,ModelBin *mb)

{
  ulong uVar1;
  bool bVar2;
  long *in_RSI;
  Mat *in_RDI;
  int size;
  int num_directions;
  Mat *in_stack_fffffffffffffee0;
  Mat *m;
  Mat local_c0;
  undefined1 local_68 [72];
  int local_20;
  int local_1c;
  long *local_18;
  int local_4;
  
  local_1c = (*(int *)&in_RDI[3].data == 2) + 1;
  uVar1 = (long)*(int *)((long)&in_RDI[2].cstep + 4) / (long)local_1c;
  local_20 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                  (long)(int)in_RDI[2].cstep) / 3;
  local_18 = in_RSI;
  (**(code **)(*in_RSI + 0x20))(local_68,in_RSI,local_20,(int)in_RDI[2].cstep * 3,local_1c,0);
  ncnn::Mat::operator=(in_RDI,in_stack_fffffffffffffee0);
  ncnn::Mat::~Mat((Mat *)0x905caa);
  bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffee0);
  if (bVar2) {
    local_4 = -100;
  }
  else {
    m = &local_c0;
    (**(code **)(*local_18 + 0x20))(m,local_18,(int)in_RDI[2].cstep,4,local_1c,0);
    ncnn::Mat::operator=(in_RDI,m);
    ncnn::Mat::~Mat((Mat *)0x905d4f);
    bVar2 = ncnn::Mat::empty(m);
    if (bVar2) {
      local_4 = -100;
    }
    else {
      (**(code **)(*local_18 + 0x20))();
      ncnn::Mat::operator=(in_RDI,m);
      ncnn::Mat::~Mat((Mat *)0x905def);
      bVar2 = ncnn::Mat::empty(m);
      if (bVar2) {
        local_4 = -100;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int GRU::load_model(const ModelBin& mb)
{
    int num_directions = direction == 2 ? 2 : 1;

    int size = weight_data_size / num_directions / num_output / 3;

    // raw weight data
    weight_xc_data = mb.load(size, num_output * 3, num_directions, 0);
    if (weight_xc_data.empty())
        return -100;

    bias_c_data = mb.load(num_output, 4, num_directions, 0);
    if (bias_c_data.empty())
        return -100;

    weight_hc_data = mb.load(num_output, num_output * 3, num_directions, 0);
    if (weight_hc_data.empty())
        return -100;

    return 0;
}